

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option.c
# Opt level: O1

_Bool option_set(char *name,int val)

{
  player *ppVar1;
  int iVar2;
  option_entry *poVar3;
  ulong uVar4;
  _Bool _Var5;
  
  _Var5 = true;
  poVar3 = options;
  uVar4 = 0;
  while ((poVar3->name == (char *)0x0 ||
         (iVar2 = strcmp(poVar3->name,name), ppVar1 = player, iVar2 != 0))) {
    _Var5 = uVar4 < 0x2c;
    uVar4 = uVar4 + 1;
    poVar3 = poVar3 + 1;
    if (uVar4 == 0x2d) {
      return _Var5;
    }
  }
  (player->opts).opt[uVar4] = val != 0;
  if (val == 0) {
    return _Var5;
  }
  if ((0x15400000UL >> (uVar4 & 0x3f) & 1) == 0) {
    return _Var5;
  }
  (ppVar1->opts).opt[uVar4 + 1] = true;
  return _Var5;
}

Assistant:

bool option_set(const char *name, int val)
{
	size_t opt;

	/* Try normal options first */
	for (opt = 0; opt < OPT_MAX; opt++) {
		if (!options[opt].name || !streq(options[opt].name, name))
			continue;

		player->opts.opt[opt] = val ? true : false;
		if (val && option_is_cheat(opt))
			player->opts.opt[opt + 1] = true;

		return true;
	}

	return false;
}